

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHeader.cpp
# Opt level: O0

void __thiscall Imf_2_5::Header::insert(Header *this,char *name,Attribute *attribute)

{
  bool bVar1;
  int iVar2;
  ArgExc *this_00;
  mapped_type pAVar3;
  mapped_type *ppAVar4;
  pointer ppVar5;
  undefined4 extraout_var;
  char *pcVar6;
  ostream *poVar7;
  undefined4 extraout_var_00;
  TypeExc *this_01;
  Attribute *pAVar8;
  long *in_RDX;
  char *in_RSI;
  Attribute *tmp_1;
  stringstream _iex_throw_s_1;
  Attribute *tmp;
  iterator i;
  stringstream _iex_throw_s;
  map<Imf_2_5::Name,_Imf_2_5::Attribute_*,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>_>_>
  *in_stack_fffffffffffffa18;
  Name *in_stack_fffffffffffffa20;
  key_type *in_stack_fffffffffffffa58;
  map<Imf_2_5::Name,_Imf_2_5::Attribute_*,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>_>_>
  *in_stack_fffffffffffffa60;
  stringstream local_550 [16];
  ostream local_540 [632];
  mapped_type local_2c8;
  _Self local_2c0 [33];
  _Self local_1b8 [3];
  stringstream local_1a0 [16];
  ostream local_190 [376];
  long *local_18;
  char *local_10;
  
  if (*in_RSI == '\0') {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_1a0);
    std::operator<<(local_190,"Image attribute name cannot be an empty string.");
    this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(this_00,local_1a0);
    __cxa_throw(this_00,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  local_18 = in_RDX;
  local_10 = in_RSI;
  Name::Name(in_stack_fffffffffffffa20,(char *)in_stack_fffffffffffffa18);
  local_1b8[0]._M_node =
       (_Base_ptr)
       std::
       map<Imf_2_5::Name,_Imf_2_5::Attribute_*,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>_>_>
       ::find(in_stack_fffffffffffffa18,(key_type *)0x12087f);
  local_2c0[0]._M_node =
       (_Base_ptr)
       std::
       map<Imf_2_5::Name,_Imf_2_5::Attribute_*,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>_>_>
       ::end(in_stack_fffffffffffffa18);
  bVar1 = std::operator==(local_1b8,local_2c0);
  if (bVar1) {
    pAVar3 = (mapped_type)(**(code **)(*local_18 + 0x18))();
    local_2c8 = pAVar3;
    Name::Name(in_stack_fffffffffffffa20,(char *)in_stack_fffffffffffffa18);
    ppAVar4 = std::
              map<Imf_2_5::Name,_Imf_2_5::Attribute_*,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>_>_>
              ::operator[](in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
    *ppAVar4 = pAVar3;
  }
  else {
    ppVar5 = std::_Rb_tree_iterator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>_>::
             operator->((_Rb_tree_iterator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>_> *)
                        0x1209aa);
    iVar2 = (*ppVar5->second->_vptr_Attribute[2])();
    pcVar6 = (char *)(**(code **)(*local_18 + 0x10))();
    iVar2 = strcmp((char *)CONCAT44(extraout_var,iVar2),pcVar6);
    if (iVar2 != 0) {
      iex_debugTrap();
      std::__cxx11::stringstream::stringstream(local_550);
      poVar7 = std::operator<<(local_540,"Cannot assign a value of type \"");
      pcVar6 = (char *)(**(code **)(*local_18 + 0x10))();
      poVar7 = std::operator<<(poVar7,pcVar6);
      poVar7 = std::operator<<(poVar7,"\" to image attribute \"");
      poVar7 = std::operator<<(poVar7,local_10);
      poVar7 = std::operator<<(poVar7,"\" of type \"");
      ppVar5 = std::_Rb_tree_iterator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>_>::
               operator->((_Rb_tree_iterator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>_>
                           *)0x120a93);
      iVar2 = (*ppVar5->second->_vptr_Attribute[2])();
      poVar7 = std::operator<<(poVar7,(char *)CONCAT44(extraout_var_00,iVar2));
      std::operator<<(poVar7,"\".");
      this_01 = (TypeExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::TypeExc::TypeExc(this_01,local_550);
      __cxa_throw(this_01,&Iex_2_5::TypeExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
    }
    pAVar8 = (Attribute *)(**(code **)(*local_18 + 0x18))();
    ppVar5 = std::_Rb_tree_iterator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>_>::
             operator->((_Rb_tree_iterator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>_> *)
                        0x120b55);
    if (ppVar5->second != (Attribute *)0x0) {
      (*ppVar5->second->_vptr_Attribute[1])();
    }
    ppVar5 = std::_Rb_tree_iterator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>_>::
             operator->((_Rb_tree_iterator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Attribute_*>_> *)
                        0x120b8b);
    ppVar5->second = pAVar8;
  }
  return;
}

Assistant:

void
Header::insert (const char name[], const Attribute &attribute)
{
    if (name[0] == 0)
	THROW (IEX_NAMESPACE::ArgExc, "Image attribute name cannot be an empty string.");

    AttributeMap::iterator i = _map.find (name);

    if (i == _map.end())
    {
	Attribute *tmp = attribute.copy();

	try
	{
	    _map[name] = tmp;
	}
	catch (...)
	{
	    delete tmp;
	    throw;
	}
    }
    else
    {
	if (strcmp (i->second->typeName(), attribute.typeName()))
	    THROW (IEX_NAMESPACE::TypeExc, "Cannot assign a value of "
				 "type \"" << attribute.typeName() << "\" "
				 "to image attribute \"" << name << "\" of "
				 "type \"" << i->second->typeName() << "\".");

	Attribute *tmp = attribute.copy();
	delete i->second;
	i->second = tmp;
    }
}